

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpumon.cpp
# Opt level: O3

void __thiscall cpumon::cpumon(cpumon *this)

{
  _Rb_tree_header *p_Var1;
  pointer ppVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  long lVar5;
  pointer ppVar6;
  initializer_list<prmon::parameter> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  char local_180 [16];
  _Alloc_hider local_170;
  char local_160 [16];
  string local_150;
  string local_130;
  string local_110;
  undefined1 local_f0 [176];
  undefined1 local_40 [16];
  
  (this->super_MessageBase).logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->super_MessageBase).logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Imonitor)._vptr_Imonitor = (_func_int **)&PTR__cpumon_001b35c8;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"utime","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"s","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  prmon::parameter::parameter((parameter *)local_f0,&local_1d0,&local_1f0,&local_110);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"stime","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"s","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
  prmon::parameter::parameter((parameter *)(local_f0 + 0x60),&local_210,&local_130,&local_150);
  __l._M_len = 2;
  __l._M_array = (iterator)local_f0;
  std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::vector
            (&this->params,__l,(allocator_type *)&local_230);
  lVar5 = -0xc0;
  puVar4 = local_40;
  do {
    if (puVar4 != *(undefined1 **)(puVar4 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar4 + -0x10));
    }
    if (puVar4 + -0x20 != *(undefined1 **)(puVar4 + -0x30)) {
      operator_delete(*(undefined1 **)(puVar4 + -0x30));
    }
    if (puVar4 + -0x40 != *(undefined1 **)(puVar4 + -0x50)) {
      operator_delete(*(undefined1 **)(puVar4 + -0x50));
    }
    puVar4 = puVar4 + -0x60;
    lVar5 = lVar5 + 0x60;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  p_Var1 = &(this->cpu_stats)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->cpu_stats)._M_t._M_impl = 0;
  *(undefined8 *)&(this->cpu_stats)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->cpu_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cpu_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->cpu_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->cpu_stats)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._0_8_ = local_f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"cpumon","");
  MessageBase::log_init(&this->super_MessageBase,(string *)local_f0,&global_logging_level);
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_);
  }
  ppVar6 = (this->params).super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->params).super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != ppVar2) {
    do {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      pcVar3 = (ppVar6->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,pcVar3,pcVar3 + (ppVar6->m_name)._M_string_length);
      local_1b0._0_8_ = local_1b0 + 0x10;
      pcVar3 = (ppVar6->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,pcVar3,pcVar3 + (ppVar6->m_name)._M_string_length);
      local_190._M_p = local_180;
      pcVar3 = (ppVar6->m_max_unit)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,pcVar3,pcVar3 + (ppVar6->m_max_unit)._M_string_length);
      pcVar3 = (ppVar6->m_avg_unit)._M_dataplus._M_p;
      local_170._M_p = local_160;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar3,pcVar3 + (ppVar6->m_avg_unit)._M_string_length);
      prmon::monitored_value::monitored_value
                ((monitored_value *)local_f0,(parameter *)local_1b0,true,0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
      ::_M_emplace_unique<std::__cxx11::string_const,prmon::monitored_value>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
                  *)&this->cpu_stats,&local_230,(monitored_value *)local_f0);
      if ((undefined1 *)local_f0._64_8_ != local_f0 + 0x50) {
        operator_delete((void *)local_f0._64_8_);
      }
      if ((undefined1 *)local_f0._32_8_ != local_f0 + 0x30) {
        operator_delete((void *)local_f0._32_8_);
      }
      if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
        operator_delete((void *)local_f0._0_8_);
      }
      if (local_170._M_p != local_160) {
        operator_delete(local_170._M_p);
      }
      if (local_190._M_p != local_180) {
        operator_delete(local_190._M_p);
      }
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != ppVar2);
  }
  return;
}

Assistant:

cpumon::cpumon() : cpu_stats{} {
  log_init(MONITOR_NAME);
#undef MONITOR_NAME
  for (const auto& param : params) {
    cpu_stats.emplace(param.get_name(), prmon::monitored_value(param, true));
  }
}